

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_CMP(Context *ctx)

{
  RegisterType RVar1;
  int iVar2;
  int sregnum;
  RegisterType sregtype;
  SourceArgInfo *src;
  int dregnum;
  RegisterType dregtype;
  DestArgInfo *dst;
  int i;
  Context *ctx_local;
  
  ctx->cmps = ctx->cmps + 1;
  iVar2 = shader_version_atleast(ctx,'\x01','\x04');
  if (iVar2 == 0) {
    RVar1 = (ctx->dest_arg).regtype;
    iVar2 = (ctx->dest_arg).regnum;
    if (3 < ctx->cmps) {
      fail(ctx,"only 3 CMP instructions allowed in this shader model");
    }
    for (dst._4_4_ = 0; dst._4_4_ < 3; dst._4_4_ = dst._4_4_ + 1) {
      if ((RVar1 == ctx->source_args[dst._4_4_].regtype) &&
         (iVar2 == ctx->source_args[dst._4_4_].regnum)) {
        fail(ctx,"CMP dest can\'t match sources in this shader model");
      }
    }
    ctx->instruction_count = ctx->instruction_count + 1;
  }
  return;
}

Assistant:

static void state_CMP(Context *ctx)
{
    ctx->cmps++;

    // extra limitations for ps <= 1.4 ...
    if (!shader_version_atleast(ctx, 1, 4))
    {
        int i;
        const DestArgInfo *dst = &ctx->dest_arg;
        const RegisterType dregtype = dst->regtype;
        const int dregnum = dst->regnum;

        if (ctx->cmps > 3)
            fail(ctx, "only 3 CMP instructions allowed in this shader model");

        for (i = 0; i < 3; i++)
        {
            const SourceArgInfo *src = &ctx->source_args[i];
            const RegisterType sregtype = src->regtype;
            const int sregnum = src->regnum;
            if ((dregtype == sregtype) && (dregnum == sregnum))
                fail(ctx, "CMP dest can't match sources in this shader model");
        } // for

        ctx->instruction_count++;  // takes an extra slot in ps_1_2 and _3.
    } // if
}